

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O0

size_t __thiscall
PsxRelocator::loadString(PsxRelocator *this,ByteArray *data,size_t pos,string *dest)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  int local_30;
  int i;
  int len;
  string *dest_local;
  size_t pos_local;
  ByteArray *data_local;
  PsxRelocator *this_local;
  
  std::__cxx11::string::clear();
  pbVar2 = ByteArray::operator[](data,pos);
  bVar1 = *pbVar2;
  dest_local = (string *)(pos + 1);
  for (local_30 = 0; local_30 < (int)(uint)bVar1; local_30 = local_30 + 1) {
    pbVar3 = ByteArray::operator[](data,(size_t)dest_local);
    std::__cxx11::string::operator+=((string *)dest,*pbVar3);
    dest_local = (string *)&dest_local->field_0x1;
  }
  return (long)(int)(bVar1 + 1);
}

Assistant:

size_t PsxRelocator::loadString(ByteArray& data, size_t pos, std::string& dest)
{
	dest.clear();
	int len = data[pos++];

	for (int i = 0; i < len; i++)
	{
		dest += data[pos++];
	}

	return len+1;
}